

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O2

void background_thread0_work(tsd_t *tsd)

{
  long lVar1;
  pthread_attr_t *attr;
  _Bool _Var2;
  uint uVar3;
  ulong uVar4;
  pthread_attr_t *ppVar5;
  pthread_attr_t *ppVar6;
  _func_void_ptr_void_ptr *start_routine;
  arena_t *arena;
  long lVar7;
  size_t sVar8;
  background_thread_info_t *pbVar9;
  ulong uStack_60;
  arena_t *local_58;
  int local_4c;
  background_thread_info_t *local_48;
  pthread_attr_t *local_40;
  pthread_attr_t *local_38;
  
  lVar1 = -(duckdb_je_max_background_threads + 0xf & 0xfffffffffffffff0);
  lVar7 = (long)&local_58 + lVar1;
  *(undefined8 *)((long)&uStack_60 + lVar1) = 1;
  for (uVar4 = *(ulong *)((long)&uStack_60 + lVar1);
      (uVar4 & 0xffffffff) < duckdb_je_max_background_threads; uVar4 = (ulong)((int)uVar4 + 1)) {
    *(undefined1 *)(lVar7 + (uVar4 & 0xffffffff)) = 0;
  }
  local_38 = (pthread_attr_t *)duckdb_je_max_background_threads;
  *(undefined8 *)((long)&uStack_60 + lVar1) = 1;
  uVar4 = *(ulong *)((long)&uStack_60 + lVar1);
  sVar8 = uVar4 & 0xffffffff;
LAB_01f845c1:
  do {
    if (duckdb_je_background_thread_info->state == background_thread_stopped) {
      *(undefined8 *)((long)&uStack_60 + lVar1) = 1;
      for (uVar4 = *(ulong *)((long)&uStack_60 + lVar1);
          ppVar5 = (pthread_attr_t *)(uVar4 & 0xffffffff), ppVar5 < local_38;
          uVar4 = (ulong)((int)uVar4 + 1)) {
        pbVar9 = duckdb_je_background_thread_info + (long)ppVar5;
        if (ppVar5->__size[lVar7] == '\x01') {
          *(undefined8 *)((long)&uStack_60 + lVar1) = 0x1f8474f;
          background_threads_disable_single(tsd,pbVar9);
        }
        else {
          *(undefined8 *)((long)&uStack_60 + lVar1) = 0x1f8475d;
          malloc_mutex_lock((tsdn_t *)tsd,&pbVar9->mtx);
          if (pbVar9->state != background_thread_stopped) {
            duckdb_je_n_background_threads = duckdb_je_n_background_threads - 1;
            pbVar9->state = background_thread_stopped;
          }
          (pbVar9->mtx).field_0.field_0.locked.repr = false;
          *(undefined8 *)((long)&uStack_60 + lVar1) = 0x1f8478a;
          pthread_mutex_unlock((pthread_mutex_t *)((long)&(pbVar9->mtx).field_0 + 0x48));
        }
      }
      duckdb_je_background_thread_info->state = background_thread_stopped;
      return;
    }
    *(undefined8 *)((long)&uStack_60 + lVar1) = 0x1f845d9;
    _Var2 = background_thread_pause_check((tsdn_t *)tsd,duckdb_je_background_thread_info);
    pbVar9 = duckdb_je_background_thread_info;
  } while (_Var2);
  if (duckdb_je_n_background_threads != sVar8) goto LAB_01f845fb;
  goto LAB_01f845ec;
LAB_01f845fb:
  (duckdb_je_background_thread_info->mtx).field_0.field_0.locked.repr = false;
  *(undefined8 *)((long)&uStack_60 + lVar1) = 0x1f8460b;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&(pbVar9->mtx).field_0 + 0x48));
  ppVar6 = (pthread_attr_t *)(uVar4 & 0xffffffff);
  ppVar5 = local_38;
  while (local_40 = ppVar6, ppVar6 < ppVar5) {
    if (ppVar6->__size[lVar7] == '\0') {
      local_48 = duckdb_je_background_thread_info;
      arena = (arena_t *)&duckdb_je_background_thread_info[(long)ppVar6].mtx;
      local_58 = arena;
      *(undefined8 *)((long)&uStack_60 + lVar1) = 0x1f8464e;
      malloc_mutex_lock((tsdn_t *)tsd,(malloc_mutex_t *)arena);
      local_4c = (int)(local_58->stats).nflushes_large;
      *(undefined1 *)&(local_58->stats).mapped = 0;
      pbVar9 = local_48 + (long)ppVar6;
      *(undefined8 *)((long)&uStack_60 + lVar1) = 0x1f84670;
      pthread_mutex_unlock((pthread_mutex_t *)((long)&(pbVar9->mtx).field_0 + 0x48));
      attr = local_40;
      ppVar5 = local_38;
      if (local_4c == 1) {
        local_48 = local_48 + (long)ppVar6;
        *(undefined8 *)((long)&uStack_60 + lVar1) = 0x1f8469e;
        ppVar5 = attr;
        pre_reentrancy(tsd,arena);
        pbVar9 = local_48;
        *(undefined8 *)((long)&uStack_60 + lVar1) = 0x1f846aa;
        uVar3 = background_thread_create_signals_masked(&pbVar9->thread,attr,start_routine,ppVar5);
        *(undefined8 *)((long)&uStack_60 + lVar1) = 0x1f846b5;
        post_reentrancy(tsd);
        if (uVar3 == 0) {
          sVar8 = (size_t)((int)sVar8 + 1);
          local_40->__size[lVar7] = '\x01';
        }
        else {
          *(undefined8 *)((long)&uStack_60 + lVar1) = 0x1f846cb;
          duckdb_je_malloc_printf
                    ("<jemalloc>: background thread creation failed (%d)\n",(ulong)uVar3);
          if (duckdb_je_opt_abort == true) {
            *(code **)((long)&uStack_60 + lVar1) = background_thread_pause_check;
            abort();
          }
        }
        break;
      }
    }
    ppVar6 = (pthread_attr_t *)(ulong)((int)local_40 + 1);
  }
  *(undefined8 *)((long)&uStack_60 + lVar1) = 0x1f84706;
  malloc_mutex_lock((tsdn_t *)tsd,&duckdb_je_background_thread_info->mtx);
  if (local_38 <= local_40) {
LAB_01f845ec:
    *(undefined8 *)((long)&uStack_60 + lVar1) = 0x1f845f9;
    background_work_sleep_once((tsdn_t *)tsd,duckdb_je_background_thread_info,0);
  }
  goto LAB_01f845c1;
}

Assistant:

static void
background_thread0_work(tsd_t *tsd) {
	/*
	 * Thread0 is also responsible for launching / terminating threads.
	 * We are guaranteed that `max_background_threads` will not change
	 * underneath us. Unfortunately static analysis tools do not understand
	 * this, so we are extracting `max_background_threads` into a local
	 * variable solely for the sake of exposing this information to such
	 * tools.
	 */
	const size_t const_max_background_threads = max_background_threads;
	assert(const_max_background_threads > 0);
	VARIABLE_ARRAY(bool, created_threads, const_max_background_threads);
	unsigned i;
	for (i = 1; i < const_max_background_threads; i++) {
		created_threads[i] = false;
	}
	/* Start working, and create more threads when asked. */
	unsigned n_created = 1;
	while (background_thread_info[0].state != background_thread_stopped) {
		if (background_thread_pause_check(tsd_tsdn(tsd),
		    &background_thread_info[0])) {
			continue;
		}
		if (check_background_thread_creation(tsd, const_max_background_threads,
		    &n_created, (bool *)&created_threads)) {
			continue;
		}
		background_work_sleep_once(tsd_tsdn(tsd),
		    &background_thread_info[0], 0);
	}

	/*
	 * Shut down other threads at exit.  Note that the ctl thread is holding
	 * the global background_thread mutex (and is waiting) for us.
	 */
	assert(!background_thread_enabled());
	for (i = 1; i < const_max_background_threads; i++) {
		background_thread_info_t *info = &background_thread_info[i];
		assert(info->state != background_thread_paused);
		if (created_threads[i]) {
			background_threads_disable_single(tsd, info);
		} else {
			malloc_mutex_lock(tsd_tsdn(tsd), &info->mtx);
			if (info->state != background_thread_stopped) {
				/* The thread was not created. */
				assert(info->state ==
				    background_thread_started);
				n_background_threads--;
				info->state = background_thread_stopped;
			}
			malloc_mutex_unlock(tsd_tsdn(tsd), &info->mtx);
		}
	}
	background_thread_info[0].state = background_thread_stopped;
	assert(n_background_threads == 1);
}